

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase *
CreateBinaryOp(ExpressionEvalContext *ctx,SynBase *source,ExprBase *lhs,ExprBase *unevaluatedRhs,
              SynBinaryOpType op)

{
  TypeBase *pTVar1;
  Allocator *pAVar2;
  byte bVar3;
  SynBase *pSVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ExprBase *pEVar8;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  ExpressionContext *pEVar9;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  undefined4 extraout_var_50;
  undefined4 extraout_var_51;
  TypeBase *pTVar10;
  undefined4 extraout_var_52;
  int iVar11;
  _func_int **pp_Var12;
  double dVar13;
  int iVar14;
  double dVar15;
  ulong uVar16;
  _func_int **pp_Var17;
  char *pcVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  longlong rhsValue;
  double lhsValue;
  double local_50;
  double local_48;
  double local_40;
  SynBase *local_38;
  
  pTVar10 = lhs->type;
  if (((pTVar10 != (TypeBase *)0x0) && (pTVar10->typeID == 0)) ||
     ((pTVar1 = unevaluatedRhs->type, pTVar1 != (TypeBase *)0x0 && (pTVar1->typeID == 0)))) {
    pcVar18 = "ERROR: encountered an error node";
    goto LAB_0014a080;
  }
  if (pTVar10 != pTVar1) {
    __assert_fail("lhs->type == unevaluatedRhs->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,599,
                  "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                 );
  }
  bVar5 = ExpressionContext::IsIntegerType(ctx->ctx,pTVar10);
  if (((bVar5) || ((lhs->type != (TypeBase *)0x0 && (lhs->type->typeID == 0x19)))) &&
     ((bVar5 = ExpressionContext::IsIntegerType(ctx->ctx,unevaluatedRhs->type), bVar5 ||
      ((unevaluatedRhs->type != (TypeBase *)0x0 && (unevaluatedRhs->type->typeID == 0x19)))))) {
    local_48 = 0.0;
    local_50 = 0.0;
    if (op == SYN_BINARY_OP_LOGICAL_OR) {
      bVar5 = TryTakeLong(lhs,(longlong *)&local_48);
      if (!bVar5) {
        return (ExprBase *)0x0;
      }
      if (local_48 == 4.94065645841247e-324) {
        pAVar2 = ctx->ctx->allocator;
        iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_01,iVar7);
        pTVar10 = ctx->ctx->typeBool;
        pEVar8->typeID = 3;
        pEVar8->source = source;
        pEVar8->type = pTVar10;
        pEVar8->next = (ExprBase *)0x0;
        *(undefined2 *)&pEVar8->listed = 0x100;
LAB_00149a38:
        pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
        return pEVar8;
      }
LAB_00149b0b:
      pEVar8 = Evaluate(ctx,unevaluatedRhs);
      if (pEVar8 == (ExprBase *)0x0) {
        bVar5 = false;
        unevaluatedRhs = (ExprBase *)0x0;
      }
      else {
        bVar5 = TryTakeLong(pEVar8,(longlong *)&local_50);
        if (bVar5) {
          pAVar2 = ctx->ctx->allocator;
          iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
          unevaluatedRhs = (ExprBase *)CONCAT44(extraout_var_03,iVar7);
          pTVar10 = ctx->ctx->typeBool;
          unevaluatedRhs->typeID = 3;
          unevaluatedRhs->source = source;
          unevaluatedRhs->type = pTVar10;
          unevaluatedRhs->next = (ExprBase *)0x0;
          unevaluatedRhs->listed = false;
          unevaluatedRhs->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
          unevaluatedRhs->field_0x29 = local_50 != 0.0;
          bVar5 = false;
        }
        else {
          bVar5 = true;
        }
      }
      if (bVar5) {
        return (ExprBase *)0x0;
      }
      return unevaluatedRhs;
    }
    if (op == SYN_BINARY_OP_LOGICAL_AND) {
      bVar5 = TryTakeLong(lhs,(longlong *)&local_48);
      if (!bVar5) {
        return (ExprBase *)0x0;
      }
      if (local_48 == 0.0) {
        pAVar2 = ctx->ctx->allocator;
        iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar7);
        pTVar10 = ctx->ctx->typeBool;
        pEVar8->typeID = 3;
        pEVar8->source = source;
        pEVar8->type = pTVar10;
        pEVar8->next = (ExprBase *)0x0;
        *(undefined2 *)&pEVar8->listed = 0;
        goto LAB_00149a38;
      }
      goto LAB_00149b0b;
    }
    pEVar8 = Evaluate(ctx,unevaluatedRhs);
    if (pEVar8 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
    local_38 = source;
    if (lhs->type != pEVar8->type) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x28a,
                    "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                   );
    }
    pEVar9 = ctx->ctx;
    pTVar10 = (&pEVar9->typeInt)[pEVar8->type == pEVar9->typeLong];
    bVar5 = TryTakeLong(lhs,(longlong *)&local_48);
    if ((!bVar5) ||
       (bVar5 = TryTakeLong(pEVar8,(longlong *)&local_50), pSVar4 = local_38, dVar15 = local_48,
       dVar13 = local_50, !bVar5)) goto LAB_0014a079;
    bVar3 = SUB81(local_50,0);
    if (pTVar10 == pEVar9->typeInt) {
      if (0x13 < op - SYN_BINARY_OP_ADD) {
switchD_00149c49_caseD_12:
        __assert_fail("!\"unexpected type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x2de,
                      "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                     );
      }
      uVar19 = SUB84(local_50,0);
      uVar20 = SUB84(local_48,0);
      switch(op) {
      case SYN_BINARY_OP_ADD:
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_05,iVar7);
        pTVar10 = lhs->type;
        uVar19 = uVar19 + uVar20;
        break;
      case SYN_BINARY_OP_SUB:
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_50,iVar7);
        pTVar10 = lhs->type;
        iVar7 = uVar20 - uVar19;
        goto LAB_0014a892;
      case SYN_BINARY_OP_MUL:
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_47,iVar7);
        pTVar10 = lhs->type;
        iVar7 = uVar20 * uVar19;
LAB_0014a892:
        pp_Var12 = (_func_int **)(long)iVar7;
        goto LAB_0014a8cb;
      case SYN_BINARY_OP_DIV:
        local_40 = local_50;
        if (uVar19 == 0) goto LAB_0014a863;
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_49,iVar7);
        pTVar10 = lhs->type;
        iVar7 = (int)((long)((ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | (ulong)dVar15 & 0xffffffff
                            ) / (long)local_40._0_4_);
        goto LAB_0014a833;
      case SYN_BINARY_OP_MOD:
        local_40 = local_50;
        if (uVar19 == 0) goto LAB_0014a72b;
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_45,iVar7);
        pTVar10 = lhs->type;
        iVar7 = (int)((long)((ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | (ulong)dVar15 & 0xffffffff
                            ) % (long)local_40._0_4_);
LAB_0014a833:
        pp_Var12 = (_func_int **)(long)iVar7;
        pEVar8->typeID = 6;
        pEVar8->source = pSVar4;
LAB_0014a83f:
        pEVar8->type = pTVar10;
        pEVar8->next = (ExprBase *)0x0;
        pEVar8->listed = false;
        pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248500;
        pEVar8[1]._vptr_ExprBase = pp_Var12;
        return pEVar8;
      case SYN_BINARY_OP_POW:
        if (-1 < (int)uVar19) {
          if (uVar19 == 0) {
            pp_Var12 = (_func_int **)0x1;
          }
          else {
            iVar7 = 1;
            dVar13 = local_48;
            dVar15 = local_50;
            do {
              iVar14 = SUB84(dVar13,0);
              iVar11 = 1;
              if (((ulong)dVar15 & 1) != 0) {
                iVar11 = iVar14;
              }
              iVar7 = iVar7 * iVar11;
              uVar19 = SUB84(dVar15,0);
              dVar13 = (double)(ulong)(uint)(iVar14 * iVar14);
              dVar15 = (double)(ulong)(uVar19 >> 1);
            } while (1 < (uVar19 & 0xfffffffe));
            pp_Var12 = (_func_int **)(long)iVar7;
          }
          goto LAB_0014a91a;
        }
        goto LAB_0014a794;
      case SYN_BINARY_OP_SHL:
        local_40 = local_48;
        if ((int)uVar19 < 0) goto LAB_0014a8fb;
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_51,iVar7);
        pTVar10 = lhs->type;
        uVar19 = SUB84(local_40,0) << (bVar3 & 0x1f);
        break;
      case SYN_BINARY_OP_SHR:
        local_40 = local_48;
        if ((int)uVar19 < 0) goto LAB_0014a8fb;
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_48,iVar7);
        pTVar10 = lhs->type;
        uVar19 = SUB84(local_40,0) >> (bVar3 & 0x1f);
        break;
      case SYN_BINARY_OP_LESS:
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_40,iVar7);
        pTVar10 = ctx->ctx->typeBool;
        bVar6 = SBORROW4(uVar20,uVar19);
        bVar5 = (int)(uVar20 - uVar19) < 0;
        goto LAB_0014a5b8;
      case SYN_BINARY_OP_LESS_EQUAL:
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_37,iVar7);
        pTVar10 = ctx->ctx->typeBool;
        bVar21 = SBORROW4(uVar20,uVar19);
        bVar6 = (int)(uVar20 - uVar19) < 0;
        bVar5 = uVar20 == uVar19;
        goto LAB_0014a4ad;
      case SYN_BINARY_OP_GREATER:
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_39,iVar7);
        pTVar10 = ctx->ctx->typeBool;
        bVar21 = SBORROW4(uVar20,uVar19);
        bVar6 = (int)(uVar20 - uVar19) < 0;
        bVar5 = uVar20 == uVar19;
        goto LAB_0014a55f;
      case SYN_BINARY_OP_GREATER_EQUAL:
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_36,iVar7);
        pTVar10 = ctx->ctx->typeBool;
        bVar6 = SBORROW4(uVar20,uVar19);
        bVar5 = (int)(uVar20 - uVar19) < 0;
        goto LAB_0014a454;
      case SYN_BINARY_OP_EQUAL:
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_38,iVar7);
        pTVar10 = ctx->ctx->typeBool;
        bVar5 = uVar20 == uVar19;
        goto LAB_0014a506;
      case SYN_BINARY_OP_NOT_EQUAL:
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_41,iVar7);
        pTVar10 = ctx->ctx->typeBool;
        bVar5 = uVar20 == uVar19;
        goto LAB_0014a611;
      case SYN_BINARY_OP_BIT_AND:
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_43,iVar7);
        pTVar10 = lhs->type;
        uVar19 = uVar19 & uVar20;
        break;
      case SYN_BINARY_OP_BIT_OR:
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_46,iVar7);
        pTVar10 = lhs->type;
        uVar19 = uVar19 | uVar20;
        break;
      case SYN_BINARY_OP_BIT_XOR:
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_44,iVar7);
        pTVar10 = lhs->type;
        uVar19 = uVar19 ^ uVar20;
        break;
      default:
        goto switchD_00149c49_caseD_12;
      case SYN_BINARY_OP_LOGICAL_XOR:
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_42,iVar7);
        pTVar10 = ctx->ctx->typeBool;
        bVar5 = uVar20 != 0;
        bVar6 = uVar19 == 0;
        goto LAB_0014a670;
      }
      pp_Var12 = (_func_int **)(long)(int)uVar19;
      goto LAB_0014a8cb;
    }
    switch(op) {
    case SYN_BINARY_OP_ADD:
      iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_02,iVar7);
      pTVar10 = lhs->type;
      pp_Var12 = (_func_int **)((long)local_50 + (long)local_48);
      break;
    case SYN_BINARY_OP_SUB:
      iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_34,iVar7);
      pTVar10 = lhs->type;
      pp_Var12 = (_func_int **)((long)local_48 - (long)local_50);
      break;
    case SYN_BINARY_OP_MUL:
      iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_31,iVar7);
      pTVar10 = lhs->type;
      pp_Var12 = (_func_int **)((long)local_50 * (long)local_48);
      break;
    case SYN_BINARY_OP_DIV:
      if (local_50 != 0.0) {
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_33,iVar7);
        pTVar10 = lhs->type;
        pp_Var12 = (_func_int **)((long)local_48 / (long)dVar13);
        pEVar8->typeID = 6;
        pEVar8->source = local_38;
        goto LAB_0014a83f;
      }
LAB_0014a863:
      pcVar18 = "ERROR: division by zero during constant folding";
      goto LAB_0014a902;
    case SYN_BINARY_OP_MOD:
      if (local_50 != 0.0) {
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_29,iVar7);
        pTVar10 = lhs->type;
        pp_Var12 = (_func_int **)((long)local_48 % (long)dVar13);
        pEVar8->typeID = 6;
        pEVar8->source = local_38;
        pEVar8->type = pTVar10;
        goto LAB_0014a40c;
      }
LAB_0014a72b:
      pcVar18 = "ERROR: modulus division by zero during constant folding";
      goto LAB_0014a902;
    case SYN_BINARY_OP_POW:
      if (-1 < (long)local_50) {
        pp_Var12 = (_func_int **)0x1;
        if (local_50 != 0.0) {
          do {
            dVar15 = 4.94065645841247e-324;
            if (((ulong)dVar13 & 1) != 0) {
              dVar15 = local_48;
            }
            pp_Var12 = (_func_int **)((long)pp_Var12 * (long)dVar15);
            uVar16 = (ulong)dVar13 & 0xfffffffffffffffe;
            local_48 = (double)((long)local_48 * (long)local_48);
            dVar13 = (double)((ulong)dVar13 >> 1);
          } while (1 < uVar16);
        }
LAB_0014a91a:
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_52,iVar7);
        pTVar10 = lhs->type;
        pEVar8->typeID = 6;
        pEVar8->source = pSVar4;
        pEVar8->type = pTVar10;
        pEVar8->next = (ExprBase *)0x0;
        pEVar8->listed = false;
        pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248500;
        pEVar8[1]._vptr_ExprBase = pp_Var12;
        return pEVar8;
      }
LAB_0014a794:
      pcVar18 = "ERROR: negative power on integer number in exponentiation during constant folding";
      goto LAB_0014a902;
    case SYN_BINARY_OP_SHL:
      if (-1 < (long)local_50) {
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_35,iVar7);
        pTVar10 = lhs->type;
        pp_Var12 = (_func_int **)((long)local_48 << (bVar3 & 0x3f));
LAB_0014a3fc:
        pEVar8->typeID = 6;
        pEVar8->source = pSVar4;
        pEVar8->type = pTVar10;
LAB_0014a40c:
        pEVar8->next = (ExprBase *)0x0;
        pEVar8->listed = false;
        pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248500;
        pEVar8[1]._vptr_ExprBase = pp_Var12;
        return pEVar8;
      }
      goto LAB_0014a8fb;
    case SYN_BINARY_OP_SHR:
      if (-1 < (long)local_50) {
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_32,iVar7);
        pTVar10 = lhs->type;
        pp_Var12 = (_func_int **)((long)local_48 >> (bVar3 & 0x3f));
        goto LAB_0014a3fc;
      }
LAB_0014a8fb:
      pcVar18 = "ERROR: negative shift value";
LAB_0014a902:
      ReportCritical(ctx,pcVar18);
      return (ExprBase *)0x0;
    case SYN_BINARY_OP_LESS:
      iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_24,iVar7);
      pTVar10 = ctx->ctx->typeBool;
      bVar6 = SBORROW8((long)local_48,(long)local_50);
      bVar5 = (long)local_48 - (long)local_50 < 0;
LAB_0014a5b8:
      pEVar8->typeID = 3;
      pEVar8->source = pSVar4;
      pEVar8->type = pTVar10;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
      pEVar8->field_0x29 = bVar6 != bVar5;
      return pEVar8;
    case SYN_BINARY_OP_LESS_EQUAL:
      iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_21,iVar7);
      pTVar10 = ctx->ctx->typeBool;
      bVar21 = SBORROW8((long)local_48,(long)local_50);
      bVar6 = (long)local_48 - (long)local_50 < 0;
      bVar5 = local_48 == local_50;
LAB_0014a4ad:
      pEVar8->typeID = 3;
      pEVar8->source = pSVar4;
      pEVar8->type = pTVar10;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
      pEVar8->field_0x29 = bVar5 || bVar21 != bVar6;
      return pEVar8;
    case SYN_BINARY_OP_GREATER:
      iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_23,iVar7);
      pTVar10 = ctx->ctx->typeBool;
      bVar21 = SBORROW8((long)local_48,(long)local_50);
      bVar6 = (long)local_48 - (long)local_50 < 0;
      bVar5 = local_48 == local_50;
LAB_0014a55f:
      pEVar8->typeID = 3;
      pEVar8->source = pSVar4;
      pEVar8->type = pTVar10;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
      pEVar8->field_0x29 = !bVar5 && bVar21 == bVar6;
      return pEVar8;
    case SYN_BINARY_OP_GREATER_EQUAL:
      iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_20,iVar7);
      pTVar10 = ctx->ctx->typeBool;
      bVar6 = SBORROW8((long)local_48,(long)local_50);
      bVar5 = (long)local_48 - (long)local_50 < 0;
LAB_0014a454:
      pEVar8->typeID = 3;
      pEVar8->source = pSVar4;
      pEVar8->type = pTVar10;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
      pEVar8->field_0x29 = bVar6 == bVar5;
      return pEVar8;
    case SYN_BINARY_OP_EQUAL:
      iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_22,iVar7);
      pTVar10 = ctx->ctx->typeBool;
      bVar5 = local_48 == local_50;
LAB_0014a506:
      pEVar8->typeID = 3;
      pEVar8->source = pSVar4;
      pEVar8->type = pTVar10;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
      pEVar8->field_0x29 = bVar5;
      return pEVar8;
    case SYN_BINARY_OP_NOT_EQUAL:
      iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_25,iVar7);
      pTVar10 = ctx->ctx->typeBool;
      bVar5 = local_48 == local_50;
LAB_0014a611:
      pEVar8->typeID = 3;
      pEVar8->source = pSVar4;
      pEVar8->type = pTVar10;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
      pEVar8->field_0x29 = !bVar5;
      return pEVar8;
    case SYN_BINARY_OP_BIT_AND:
      iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_27,iVar7);
      pTVar10 = lhs->type;
      pp_Var12 = (_func_int **)((ulong)local_50 & (ulong)local_48);
      break;
    case SYN_BINARY_OP_BIT_OR:
      iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_30,iVar7);
      pTVar10 = lhs->type;
      pp_Var12 = (_func_int **)((ulong)local_50 | (ulong)local_48);
      break;
    case SYN_BINARY_OP_BIT_XOR:
      iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x38);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_28,iVar7);
      pTVar10 = lhs->type;
      pp_Var12 = (_func_int **)((ulong)local_50 ^ (ulong)local_48);
      break;
    default:
      __assert_fail("!\"unexpected type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x32a,
                    "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                   );
    case SYN_BINARY_OP_LOGICAL_XOR:
      iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_26,iVar7);
      pTVar10 = ctx->ctx->typeBool;
      bVar5 = local_48 != 0.0;
      bVar6 = local_50 == 0.0;
LAB_0014a670:
      pEVar8->typeID = 3;
      pEVar8->source = pSVar4;
      pEVar8->type = pTVar10;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
      pEVar8->field_0x29 = !bVar6 ^ bVar5;
      return pEVar8;
    }
LAB_0014a8cb:
    pEVar8->typeID = 6;
    pEVar8->source = pSVar4;
    pEVar8->type = pTVar10;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248500;
    pEVar8[1]._vptr_ExprBase = pp_Var12;
    return pEVar8;
  }
  pEVar8 = Evaluate(ctx,unevaluatedRhs);
  if (pEVar8 == (ExprBase *)0x0) {
    return (ExprBase *)0x0;
  }
  bVar5 = ExpressionContext::IsFloatingPointType(ctx->ctx,lhs->type);
  if ((!bVar5) || (bVar5 = ExpressionContext::IsFloatingPointType(ctx->ctx,pEVar8->type), !bVar5)) {
    pTVar10 = lhs->type;
    pEVar9 = ctx->ctx;
    if ((pTVar10 == pEVar9->typeTypeID) && (pEVar8->type == pEVar9->typeTypeID)) {
      if ((lhs == (ExprBase *)0x0) || (lhs->typeID != 8)) {
        lhs = (ExprBase *)0x0;
      }
      if (lhs == (ExprBase *)0x0) {
        pp_Var12 = (_func_int **)0x0;
      }
      else {
        pp_Var12 = lhs[1]._vptr_ExprBase;
      }
      bVar5 = true;
      if ((lhs != (ExprBase *)0x0) && (pEVar8->typeID == 8)) {
        pp_Var17 = pEVar8[1]._vptr_ExprBase;
        if (op == SYN_BINARY_OP_NOT_EQUAL) {
          iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
          pEVar8 = (ExprBase *)CONCAT44(extraout_var_08,iVar7);
          bVar5 = pp_Var12 != pp_Var17;
        }
        else {
          if (op != SYN_BINARY_OP_EQUAL) goto joined_r0x00149d2c;
          iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
          pEVar8 = (ExprBase *)CONCAT44(extraout_var_04,iVar7);
          bVar5 = pp_Var12 == pp_Var17;
        }
        pTVar10 = ctx->ctx->typeBool;
        pEVar8->typeID = 3;
        pEVar8->source = source;
        pEVar8->type = pTVar10;
        pEVar8->next = (ExprBase *)0x0;
        pEVar8->listed = false;
        pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
        pEVar8->field_0x29 = bVar5;
        bVar5 = false;
      }
joined_r0x00149d2c:
      if (!bVar5) {
        return pEVar8;
      }
    }
    else if ((((pTVar10 != (TypeBase *)0x0) && (pTVar10->typeID == 0x12)) &&
             (pTVar1 = pEVar8->type, pTVar1 != (TypeBase *)0x0)) && (pTVar1->typeID == 0x12)) {
      if (pTVar10 != pTVar1) {
        __assert_fail("lhs->type == rhs->type",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x371,
                      "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                     );
      }
      if (lhs == (ExprBase *)0x0) {
LAB_00149c80:
        lhs = (ExprBase *)0x0;
LAB_00149c83:
        if (lhs == (ExprBase *)0x0) {
          __assert_fail("!\"unknown type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x37a,
                        "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                       );
        }
        pp_Var12 = lhs[1]._vptr_ExprBase;
      }
      else {
        if (lhs->typeID != 9) {
          if ((lhs == (ExprBase *)0x0) || (lhs->typeID != 0xc)) goto LAB_00149c80;
          goto LAB_00149c83;
        }
        pp_Var12 = (_func_int **)0x0;
      }
      if (pEVar8->typeID == 9) {
        pp_Var17 = (_func_int **)0x0;
      }
      else {
        if (pEVar8->typeID != 0xc) {
          __assert_fail("!\"unknown type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,899,
                        "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                       );
        }
        pp_Var17 = pEVar8[1]._vptr_ExprBase;
      }
      if (op == SYN_BINARY_OP_NOT_EQUAL) {
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_07,iVar7);
        bVar5 = pp_Var12 != pp_Var17;
      }
      else {
        if (op != SYN_BINARY_OP_EQUAL) {
          bVar5 = true;
          goto joined_r0x00149d2c;
        }
        iVar7 = (*pEVar9->allocator->_vptr_Allocator[2])(pEVar9->allocator,0x30);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_06,iVar7);
        bVar5 = pp_Var12 == pp_Var17;
      }
      pTVar10 = ctx->ctx->typeBool;
      pEVar8->typeID = 3;
      pEVar8->source = source;
      pEVar8->type = pTVar10;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
      pEVar8->field_0x29 = bVar5;
      bVar5 = false;
      goto joined_r0x00149d2c;
    }
    goto LAB_0014a079;
  }
  if (lhs->type != pEVar8->type) {
    __assert_fail("lhs->type == rhs->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x33a,
                  "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                 );
  }
  local_48 = 0.0;
  local_50 = 0.0;
  bVar6 = TryTakeDouble(lhs,&local_48);
  bVar5 = true;
  if ((!bVar6) || (bVar6 = TryTakeDouble(pEVar8,&local_50), !bVar6)) goto LAB_0014a074;
  switch(op) {
  case SYN_BINARY_OP_ADD:
    pAVar2 = ctx->ctx->allocator;
    iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_00,iVar7);
    pTVar10 = lhs->type;
    pp_Var12 = (_func_int **)(local_48 + local_50);
    break;
  case SYN_BINARY_OP_SUB:
    pAVar2 = ctx->ctx->allocator;
    iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_14,iVar7);
    pTVar10 = lhs->type;
    pp_Var12 = (_func_int **)(local_48 - local_50);
    break;
  case SYN_BINARY_OP_MUL:
    pAVar2 = ctx->ctx->allocator;
    iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_16,iVar7);
    pTVar10 = lhs->type;
    pp_Var12 = (_func_int **)(local_48 * local_50);
    break;
  case SYN_BINARY_OP_DIV:
    pAVar2 = ctx->ctx->allocator;
    iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_18,iVar7);
    pTVar10 = lhs->type;
    pp_Var12 = (_func_int **)(local_48 / local_50);
    break;
  case SYN_BINARY_OP_MOD:
    pAVar2 = ctx->ctx->allocator;
    iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_13,iVar7);
    pTVar10 = lhs->type;
    pp_Var12 = (_func_int **)fmod(local_48,local_50);
    goto LAB_00149f1e;
  case SYN_BINARY_OP_POW:
    pAVar2 = ctx->ctx->allocator;
    iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_15,iVar7);
    pTVar10 = lhs->type;
    pp_Var12 = (_func_int **)pow(local_48,local_50);
LAB_00149f1e:
    pEVar8->typeID = 7;
    pEVar8->source = source;
    pEVar8->type = pTVar10;
    goto LAB_00149ff9;
  default:
    __assert_fail("!\"unexpected type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x35c,
                  "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                 );
  case SYN_BINARY_OP_LESS:
    pAVar2 = ctx->ctx->allocator;
    iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_19,iVar7);
    pEVar9 = ctx->ctx;
    bVar5 = local_50 == local_48;
    bVar6 = local_50 < local_48;
    goto LAB_0014a03f;
  case SYN_BINARY_OP_LESS_EQUAL:
    pAVar2 = ctx->ctx->allocator;
    iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_17,iVar7);
    pEVar9 = ctx->ctx;
    bVar5 = local_50 < local_48;
    goto LAB_00149f88;
  case SYN_BINARY_OP_GREATER:
    pAVar2 = ctx->ctx->allocator;
    iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_12,iVar7);
    pEVar9 = ctx->ctx;
    bVar5 = local_48 == local_50;
    bVar6 = local_48 < local_50;
LAB_0014a03f:
    pTVar10 = pEVar9->typeBool;
    pEVar8->typeID = 3;
    pEVar8->source = source;
    pEVar8->type = pTVar10;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
    pEVar8->field_0x29 = !bVar6 && !bVar5;
    goto LAB_0014a072;
  case SYN_BINARY_OP_GREATER_EQUAL:
    pAVar2 = ctx->ctx->allocator;
    iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_10,iVar7);
    pEVar9 = ctx->ctx;
    bVar5 = local_48 < local_50;
LAB_00149f88:
    pTVar10 = pEVar9->typeBool;
    pEVar8->typeID = 3;
    pEVar8->source = source;
    pEVar8->type = pTVar10;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
    pEVar8->field_0x29 = !bVar5;
    goto LAB_0014a072;
  case SYN_BINARY_OP_EQUAL:
    pAVar2 = ctx->ctx->allocator;
    iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_11,iVar7);
    pTVar10 = ctx->ctx->typeBool;
    bVar5 = local_48 == local_50;
    goto LAB_00149e30;
  case SYN_BINARY_OP_NOT_EQUAL:
    pAVar2 = ctx->ctx->allocator;
    iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_09,iVar7);
    pTVar10 = ctx->ctx->typeBool;
    bVar5 = local_48 != local_50;
LAB_00149e30:
    pEVar8->typeID = 3;
    pEVar8->source = source;
    pEVar8->type = pTVar10;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
    pEVar8->field_0x29 = bVar5;
    goto LAB_0014a072;
  }
  pEVar8->typeID = 7;
  pEVar8->source = source;
  pEVar8->type = pTVar10;
LAB_00149ff9:
  pEVar8->next = (ExprBase *)0x0;
  pEVar8->listed = false;
  pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248538;
  pEVar8[1]._vptr_ExprBase = pp_Var12;
LAB_0014a072:
  bVar5 = false;
LAB_0014a074:
  if (!bVar5) {
    return pEVar8;
  }
LAB_0014a079:
  pcVar18 = "ERROR: failed to eval binary op";
LAB_0014a080:
  Report(ctx,pcVar18);
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* CreateBinaryOp(ExpressionEvalContext &ctx, SynBase *source, ExprBase *lhs, ExprBase *unevaluatedRhs, SynBinaryOpType op)
{
	if(isType<TypeError>(lhs->type) || isType<TypeError>(unevaluatedRhs->type))
		return Report(ctx, "ERROR: encountered an error node");

	assert(lhs->type == unevaluatedRhs->type);

	if((ctx.ctx.IsIntegerType(lhs->type) || isType<TypeEnum>(lhs->type)) && (ctx.ctx.IsIntegerType(unevaluatedRhs->type) || isType<TypeEnum>(unevaluatedRhs->type)))
	{
		long long lhsValue = 0;
		long long rhsValue = 0;

		// Short-circuit behaviour
		if(op == SYN_BINARY_OP_LOGICAL_AND)
		{
			if(TryTakeLong(lhs, lhsValue))
			{
				if(lhsValue == 0)
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, false);

				ExprBase *rhs = Evaluate(ctx, unevaluatedRhs);

				if(!rhs)
					return NULL;

				if(TryTakeLong(rhs, rhsValue))
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, rhsValue != 0);
			}

			return NULL;
		}

		if(op == SYN_BINARY_OP_LOGICAL_OR)
		{
			if(TryTakeLong(lhs, lhsValue))
			{
				if(lhsValue == 1)
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, true);

				ExprBase *rhs = Evaluate(ctx, unevaluatedRhs);

				if(!rhs)
					return NULL;

				if(TryTakeLong(rhs, rhsValue))
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, rhsValue != 0);
			}

			return NULL;
		}

		ExprBase *rhs = Evaluate(ctx, unevaluatedRhs);

		if(!rhs)
			return NULL;

		assert(lhs->type == rhs->type);

		TypeBase *resultType = ctx.ctx.typeInt;

		if(lhs->type == ctx.ctx.typeLong || rhs->type == ctx.ctx.typeLong)
			resultType = ctx.ctx.typeLong;

		if(TryTakeLong(lhs, lhsValue) && TryTakeLong(rhs, rhsValue))
		{
			if(resultType == ctx.ctx.typeInt)
			{
				int lhsValueInt = int(lhsValue);
				int rhsValueInt = int(rhsValue);

				switch(op)
				{
				case SYN_BINARY_OP_ADD:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt + rhsValueInt);
				case SYN_BINARY_OP_SUB:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt - rhsValueInt);
				case SYN_BINARY_OP_MUL:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, int(lhsValueInt * rhsValueInt));
				case SYN_BINARY_OP_DIV:
					if(rhsValueInt == 0)
						return ReportCritical(ctx, "ERROR: division by zero during constant folding");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt / rhsValueInt);
				case SYN_BINARY_OP_MOD:
					if(rhsValueInt == 0)
						return ReportCritical(ctx, "ERROR: modulus division by zero during constant folding");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt % rhsValueInt);
				case SYN_BINARY_OP_POW:
					if(rhsValueInt < 0)
						return ReportCritical(ctx, "ERROR: negative power on integer number in exponentiation during constant folding");

					int result, power;

					result = 1;
					power = rhsValueInt;

					while(power)
					{
						if(power & 1)
						{
							result *= lhsValueInt;
							power--;
						}
						lhsValueInt *= lhsValueInt;
						power >>= 1;
					}

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, result);
				case SYN_BINARY_OP_SHL:
					if(rhsValueInt < 0)
						return ReportCritical(ctx, "ERROR: negative shift value");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt << rhsValueInt);
				case SYN_BINARY_OP_SHR:
					if(rhsValueInt < 0)
						return ReportCritical(ctx, "ERROR: negative shift value");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt >> rhsValueInt);
				case SYN_BINARY_OP_LESS:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt < rhsValueInt);
				case SYN_BINARY_OP_LESS_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt <= rhsValueInt);
				case SYN_BINARY_OP_GREATER:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt > rhsValueInt);
				case SYN_BINARY_OP_GREATER_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt >= rhsValueInt);
				case SYN_BINARY_OP_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt == rhsValueInt);
				case SYN_BINARY_OP_NOT_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt != rhsValueInt);
				case SYN_BINARY_OP_BIT_AND:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt & rhsValueInt);
				case SYN_BINARY_OP_BIT_OR:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt | rhsValueInt);
				case SYN_BINARY_OP_BIT_XOR:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt ^ rhsValueInt);
				case SYN_BINARY_OP_LOGICAL_XOR:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, !!lhsValueInt != !!rhsValueInt);
				default:
					assert(!"unexpected type");
					break;
				}
			}
			else
			{
				switch(op)
				{
				case SYN_BINARY_OP_ADD:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue + rhsValue);
				case SYN_BINARY_OP_SUB:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue - rhsValue);
				case SYN_BINARY_OP_MUL:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue * rhsValue);
				case SYN_BINARY_OP_DIV:
					if(rhsValue == 0)
						return ReportCritical(ctx, "ERROR: division by zero during constant folding");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue / rhsValue);
				case SYN_BINARY_OP_MOD:
					if(rhsValue == 0)
						return ReportCritical(ctx, "ERROR: modulus division by zero during constant folding");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue % rhsValue);
				case SYN_BINARY_OP_POW:
					if(rhsValue < 0)
						return ReportCritical(ctx, "ERROR: negative power on integer number in exponentiation during constant folding");

					long long result, power;

					result = 1;
					power = rhsValue;

					while(power)
					{
						if(power & 1)
						{
							result *= lhsValue;
							power--;
						}
						lhsValue *= lhsValue;
						power >>= 1;
					}

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, result);
				case SYN_BINARY_OP_SHL:
					if(rhsValue < 0)
						return ReportCritical(ctx, "ERROR: negative shift value");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue << rhsValue);
				case SYN_BINARY_OP_SHR:
					if(rhsValue < 0)
						return ReportCritical(ctx, "ERROR: negative shift value");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue >> rhsValue);
				case SYN_BINARY_OP_LESS:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue < rhsValue);
				case SYN_BINARY_OP_LESS_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue <= rhsValue);
				case SYN_BINARY_OP_GREATER:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue > rhsValue);
				case SYN_BINARY_OP_GREATER_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue >= rhsValue);
				case SYN_BINARY_OP_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue == rhsValue);
				case SYN_BINARY_OP_NOT_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue != rhsValue);
				case SYN_BINARY_OP_BIT_AND:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue & rhsValue);
				case SYN_BINARY_OP_BIT_OR:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue | rhsValue);
				case SYN_BINARY_OP_BIT_XOR:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue ^ rhsValue);
				case SYN_BINARY_OP_LOGICAL_XOR:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, !!lhsValue != !!rhsValue);
				default:
					assert(!"unexpected type");
					break;
				}
			}
		}

		return Report(ctx, "ERROR: failed to eval binary op");
	}

	ExprBase *rhs = Evaluate(ctx, unevaluatedRhs);

	if(!rhs)
		return NULL;

	if(ctx.ctx.IsFloatingPointType(lhs->type) && ctx.ctx.IsFloatingPointType(rhs->type))
	{
		assert(lhs->type == rhs->type);

		double lhsValue = 0;
		double rhsValue = 0;

		if(TryTakeDouble(lhs, lhsValue) && TryTakeDouble(rhs, rhsValue))
		{
			switch(op)
			{
			case SYN_BINARY_OP_ADD:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, lhsValue + rhsValue);
			case SYN_BINARY_OP_SUB:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, lhsValue - rhsValue);
			case SYN_BINARY_OP_MUL:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, lhsValue * rhsValue);
			case SYN_BINARY_OP_DIV:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, lhsValue / rhsValue);
			case SYN_BINARY_OP_MOD:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, fmod(lhsValue, rhsValue));
			case SYN_BINARY_OP_POW:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, pow(lhsValue, rhsValue));
			case SYN_BINARY_OP_LESS:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue < rhsValue);
			case SYN_BINARY_OP_LESS_EQUAL:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue <= rhsValue);
			case SYN_BINARY_OP_GREATER:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue > rhsValue);
			case SYN_BINARY_OP_GREATER_EQUAL:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue >= rhsValue);
			case SYN_BINARY_OP_EQUAL:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue == rhsValue);
			case SYN_BINARY_OP_NOT_EQUAL:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue != rhsValue);
			default:
				assert(!"unexpected type");
				break;
			}
		}
	}
	else if(lhs->type == ctx.ctx.typeTypeID && rhs->type == ctx.ctx.typeTypeID)
	{
		TypeBase *lhsValue = NULL;
		TypeBase *rhsValue = NULL;

		if(TryTakeTypeId(lhs, lhsValue) && TryTakeTypeId(rhs, rhsValue))
		{
			if(op == SYN_BINARY_OP_EQUAL)
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue == rhsValue);

			if(op == SYN_BINARY_OP_NOT_EQUAL)
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue != rhsValue);
		}
	}
	else if(isType<TypeRef>(lhs->type) && isType<TypeRef>(rhs->type))
	{
		assert(lhs->type == rhs->type);

		void *lPtr = NULL;

		if(isType<ExprNullptrLiteral>(lhs))
			lPtr = NULL;
		else if(ExprPointerLiteral *value = getType<ExprPointerLiteral>(lhs))
			lPtr = value->ptr;
		else
			assert(!"unknown type");

		void *rPtr = NULL;

		if(isType<ExprNullptrLiteral>(rhs))
			rPtr = NULL;
		else if(ExprPointerLiteral *value = getType<ExprPointerLiteral>(rhs))
			rPtr = value->ptr;
		else
			assert(!"unknown type");

		if(op == SYN_BINARY_OP_EQUAL)
			return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lPtr == rPtr);

		if(op == SYN_BINARY_OP_NOT_EQUAL)
			return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lPtr != rPtr);
	}

	return Report(ctx, "ERROR: failed to eval binary op");
}